

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformDefinitions(UniformCase *this,ostringstream *dst)

{
  pointer ppSVar1;
  pointer pUVar2;
  dataTypePredicate predicate;
  StructType *pSVar3;
  UniformCase *pUVar4;
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  ostream *poVar8;
  UniformCollection *pUVar9;
  int i;
  long lVar10;
  long lVar11;
  allocator<char> local_a1;
  ostringstream *local_a0;
  UniformCase *local_98;
  string local_90;
  DeclareVariable local_70;
  
  lVar10 = 0;
  local_a0 = dst;
  while( true ) {
    pUVar9 = (this->m_uniformCollection).m_ptr;
    ppSVar1 = (pUVar9->m_structTypes).
              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pUVar9->m_structTypes).
                            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3) <=
        lVar10) break;
    local_70.varType._0_8_ = ppSVar1[lVar10];
    local_70.varType.m_data.basic.type = TYPE_INVALID;
    poVar8 = glu::decl::operator<<
                       (&local_a0->super_basic_ostream<char,_std::char_traits<char>_>,
                        (DeclareStructTypePtr *)&local_70);
    std::operator<<(poVar8,";\n");
    lVar10 = lVar10 + 1;
  }
  lVar10 = 0x20;
  local_98 = this;
  for (lVar11 = 0; pUVar4 = local_98,
      lVar11 < (int)(((long)(pUVar9->m_uniforms).
                            super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pUVar9->m_uniforms).
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar11 = lVar11 + 1)
  {
    poVar8 = std::operator<<(&local_a0->super_basic_ostream<char,_std::char_traits<char>_>,
                             "uniform ");
    pUVar2 = (((pUVar4->m_uniformCollection).m_ptr)->m_uniforms).
             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,*(char **)((long)pUVar2 + lVar10 + -0x20),&local_a1);
    glu::decl::DeclareVariable::DeclareVariable
              (&local_70,(VarType *)((long)&pUVar2->name + lVar10),&local_90,0);
    poVar8 = glu::decl::operator<<(poVar8,&local_70);
    std::operator<<(poVar8,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pUVar9 = (local_98->m_uniformCollection).m_ptr;
    lVar10 = lVar10 + 0x38;
  }
  std::operator<<(&local_a0->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  anon_unknown_1::UniformCollection::getSamplerTypes
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_70,
             (pUVar4->m_uniformCollection).m_ptr);
  uVar5 = local_70.varType._0_8_;
  pSVar3 = (StructType *)
           CONCAT44(local_70.varType.m_data.basic.precision,local_70.varType.m_data.basic.type);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&local_70);
  lVar10 = 0x10;
  do {
    if (lVar10 == 0x178) {
      return;
    }
    predicate = *(dataTypePredicate *)((long)&PTR_iterate_01e1da20 + lVar10);
    if ((StructType *)uVar5 == pSVar3) {
LAB_00ed31ab:
      bVar6 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        ((local_98->m_uniformCollection).m_ptr,predicate);
      if (bVar6) goto LAB_00ed31dd;
      bVar6 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                        ((local_98->m_uniformCollection).m_ptr,
                         *(dataTypePredicate *)((long)&PTR___cxa_pure_virtual_01e1da28 + lVar10));
      if (bVar6) goto LAB_00ed31dd;
    }
    else {
      bVar6 = (*predicate)(TYPE_FLOAT_VEC4);
      if (!bVar6) {
        cVar7 = (**(code **)((long)&PTR___cxa_pure_virtual_01e1da28 + lVar10))(4);
        if (cVar7 == '\0') goto LAB_00ed31ab;
      }
LAB_00ed31dd:
      poVar8 = std::operator<<(&local_a0->super_basic_ostream<char,_std::char_traits<char>_>,
                               *(char **)((long)writeUniformDefinitions::compareFuncs[0].
                                                requiringTypes + lVar10));
      std::operator<<(poVar8,"\n");
    }
    lVar10 = lVar10 + 0x18;
  } while( true );
}

Assistant:

void UniformCase::writeUniformDefinitions (std::ostringstream& dst) const
{
	for (int i = 0; i < (int)m_uniformCollection->getNumStructTypes(); i++)
		dst << glu::declare(m_uniformCollection->getStructType(i)) << ";\n";

	for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
		dst << "uniform " << glu::declare(m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str()) << ";\n";

	dst << "\n";

	{
		static const struct
		{
			dataTypePredicate	requiringTypes[2];
			const char*			definition;
		} compareFuncs[] =
		{
			{ { glu::isDataTypeFloatOrVec,				glu::isDataTypeMatrix				}, "mediump float compare_float    (mediump float a, mediump float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }"																		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC2>,	dataTypeIsMatrixWithNRows<2>		}, "mediump float compare_vec2     (mediump vec2 a, mediump vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }"														},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC3>,	dataTypeIsMatrixWithNRows<3>		}, "mediump float compare_vec3     (mediump vec3 a, mediump vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }"								},
			{ { dataTypeEquals<glu::TYPE_FLOAT_VEC4>,	dataTypeIsMatrixWithNRows<4>		}, "mediump float compare_vec4     (mediump vec4 a, mediump vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }"		},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat2     (mediump mat2 a, mediump mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }"													},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat3     (mediump mat3 a, mediump mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }"							},
			{ { dataTypeEquals<glu::TYPE_FLOAT_MAT4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_mat4     (mediump mat4 a, mediump mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }"	},
			{ { dataTypeEquals<glu::TYPE_INT>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_int      (mediump int a, mediump int b)      { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC2>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec2    (mediump ivec2 a, mediump ivec2 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC3>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec3    (mediump ivec3 a, mediump ivec3 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_INT_VEC4>,		dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_ivec4    (mediump ivec4 a, mediump ivec4 b)  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL>,			dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bool     (bool a, bool b)                    { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC2>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec2    (bvec2 a, bvec2 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC3>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec3    (bvec3 a, bvec3 b)                  { return a == b ? 1.0 : 0.0; }"																					},
			{ { dataTypeEquals<glu::TYPE_BOOL_VEC4>,	dataTypeEquals<glu::TYPE_INVALID>	}, "mediump float compare_bvec4    (bvec4 a, bvec4 b)                  { return a == b ? 1.0 : 0.0; }"																					}
		};

		const bool containsSamplers = !m_uniformCollection->getSamplerTypes().empty();

		for (int compFuncNdx = 0; compFuncNdx < DE_LENGTH_OF_ARRAY(compareFuncs); compFuncNdx++)
		{
			const dataTypePredicate		(&typeReq)[2]			= compareFuncs[compFuncNdx].requiringTypes;
			const bool					containsTypeSampler		= containsSamplers && (typeReq[0](glu::TYPE_FLOAT_VEC4) || typeReq[1](glu::TYPE_FLOAT_VEC4));

			if (containsTypeSampler || m_uniformCollection->containsMatchingBasicType(typeReq[0]) || m_uniformCollection->containsMatchingBasicType(typeReq[1]))
				dst << compareFuncs[compFuncNdx].definition << "\n";
		}
	}
}